

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall mkvmuxer::Tag::Clear(Tag *this)

{
  undefined8 *in_RDI;
  SimpleTag *st;
  SimpleTag *in_stack_ffffffffffffffe0;
  
  while (0 < *(int *)((long)in_RDI + 0xc)) {
    *(int *)((long)in_RDI + 0xc) = *(int *)((long)in_RDI + 0xc) + -1;
    SimpleTag::Clear(in_stack_ffffffffffffffe0);
  }
  if ((void *)*in_RDI != (void *)0x0) {
    operator_delete__((void *)*in_RDI);
  }
  *in_RDI = 0;
  *(undefined4 *)(in_RDI + 1) = 0;
  return;
}

Assistant:

void Tag::Clear() {
  while (simple_tags_count_ > 0) {
    SimpleTag& st = simple_tags_[--simple_tags_count_];
    st.Clear();
  }

  delete[] simple_tags_;
  simple_tags_ = NULL;

  simple_tags_size_ = 0;
}